

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvd.inc.c
# Opt level: O3

_Bool trans_fsgnj_d(DisasContext_conflict12 *ctx,arg_fsgnj_d *a)

{
  int iVar1;
  TCGContext_conflict11 *tcg_ctx;
  TCGv_i64 ret;
  undefined1 extraout_AL;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  iVar1 = a->rs1;
  ret = tcg_ctx->cpu_fpr[a->rd];
  if (iVar1 == a->rs2) {
    if (ret != tcg_ctx->cpu_fpr[iVar1]) {
      tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(ret + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_fpr[iVar1] + (long)tcg_ctx));
    }
  }
  else {
    tcg_gen_deposit_i64_riscv64(tcg_ctx,ret,tcg_ctx->cpu_fpr[a->rs2],tcg_ctx->cpu_fpr[iVar1],0,0x3f)
    ;
  }
  mark_fs_dirty(ctx);
  return (_Bool)extraout_AL;
}

Assistant:

static bool trans_fsgnj_d(DisasContext *ctx, arg_fsgnj_d *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (a->rs1 == a->rs2) { /* FMOV */
        tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rs1]);
    } else {
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rs2],
                            tcg_ctx->cpu_fpr[a->rs1], 0, 63);
    }
    mark_fs_dirty(ctx);
    return true;
}